

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  bool bVar3;
  sqlite3 *db_00;
  TriggerPrg *p;
  int iVar4;
  char *pcVar5;
  long lVar6;
  Vdbe *pVVar7;
  long lVar8;
  bool bVar9;
  char *zErrMsg;
  u32 local_1ec;
  ulong local_1e8;
  char *local_1e0;
  sqlite3_stmt **local_1d8;
  Vdbe *local_1d0;
  Parse local_1c8;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  local_1d8 = ppStmt;
  local_1d0 = pOld;
  iVar4 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar4 == 0)) {
    iVar4 = sqlite3MisuseError(0x1e012);
    return iVar4;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  local_1e8 = (ulong)(uint)nBytes;
  local_1e0 = zSql + local_1e8;
  bVar9 = true;
  do {
    do {
      bVar3 = bVar9;
      zErrMsg = (char *)0x0;
      memset(&local_1c8,0,0xc4);
      memset(&local_1c8.sLastToken,0,0xa0);
      local_1c8.pReprepare = local_1d0;
      if ((prepFlags & 1) != 0) {
        local_1c8.disableLookaside = '\x01';
        (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      }
      lVar8 = 0;
      for (lVar6 = 0; lVar6 < db->nDb; lVar6 = lVar6 + 1) {
        pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar8);
        if (pBVar2 != (Btree *)0x0) {
          sqlite3BtreeEnter(pBVar2);
          iVar4 = querySharedCacheTableLock(pBVar2,1,'\x01');
          sqlite3BtreeLeave(pBVar2);
          if (iVar4 != 0) {
            sqlite3ErrorWithMsg(db,iVar4,"database schema is locked: %s",
                                *(undefined8 *)((long)&db->aDb->zDbSName + lVar8));
            goto LAB_0013262d;
          }
        }
        lVar8 = lVar8 + 0x20;
      }
      sqlite3VtabUnlockList(db);
      local_1c8.db = db;
      if ((nBytes < 0) || ((nBytes != 0 && (zSql[local_1e8 - 1] == '\0')))) {
        sqlite3RunParser(&local_1c8,zSql,&zErrMsg);
LAB_001323ef:
        db_00 = local_1c8.db;
        if (local_1c8.rc == 0x65) {
          local_1c8.rc = 0;
        }
        if (local_1c8.checkSchema != '\0') {
          lVar8 = 0;
          for (lVar6 = 0; lVar6 < db_00->nDb; lVar6 = lVar6 + 1) {
            pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar8);
            if (pBVar2 != (Btree *)0x0) {
              uVar1 = pBVar2->inTrans;
              if ((uVar1 == '\0') &&
                 (iVar4 = sqlite3BtreeBeginTrans(pBVar2,0,(int *)0x0), iVar4 != 0)) {
                if ((iVar4 == 0xc0a) || (iVar4 == 7)) {
                  sqlite3OomFault(db_00);
                }
                break;
              }
              sqlite3BtreeGetMeta(pBVar2,1,&local_1ec);
              if (local_1ec != **(u32 **)((long)&db_00->aDb->pSchema + lVar8)) {
                sqlite3ResetOneSchema(db_00,(int)lVar6);
                local_1c8.rc = 0x11;
              }
              if (uVar1 == '\0') {
                sqlite3BtreeCommit(pBVar2);
              }
            }
            lVar8 = lVar8 + 0x20;
          }
        }
        if (db->mallocFailed != '\0') {
          local_1c8.rc = 7;
        }
        iVar4 = local_1c8.rc;
        if (pzTail != (char **)0x0) {
          *pzTail = local_1c8.zTail;
        }
        if ((local_1c8.explain != '\0' && local_1c8.pVdbe != (Vdbe *)0x0) && local_1c8.rc == 0) {
          bVar9 = local_1c8.explain == '\x02';
          sqlite3VdbeSetNumCols(local_1c8.pVdbe,(uint)!bVar9 * 4 + 4);
          for (lVar6 = 0; ((ulong)bVar9 * 4 + 8) - (ulong)((uint)bVar9 * 8) != lVar6;
              lVar6 = lVar6 + 1) {
            sqlite3VdbeSetColName
                      (local_1c8.pVdbe,(int)lVar6,0,
                       sqlite3Prepare_azColName_rel +
                       *(int *)(sqlite3Prepare_azColName_rel + (ulong)bVar9 * 0x20 + lVar6 * 4),
                       (_func_void_void_ptr *)0x0);
          }
        }
        pVVar7 = local_1c8.pVdbe;
        if ((db->init).busy == '\0') {
          if (local_1c8.pVdbe != (Vdbe *)0x0) {
            (local_1c8.pVdbe)->prepFlags = (u8)prepFlags;
            if (-1 < (char)(u8)prepFlags) {
              (local_1c8.pVdbe)->expmask = 0;
            }
            pcVar5 = sqlite3DbStrNDup((local_1c8.pVdbe)->db,zSql,
                                      (long)((int)local_1c8.zTail - (int)zSql));
            pVVar7->zSql = pcVar5;
            goto LAB_001325b3;
          }
LAB_001325cd:
          pVVar7 = (Vdbe *)0x0;
LAB_001325cf:
          *local_1d8 = (sqlite3_stmt *)pVVar7;
        }
        else {
LAB_001325b3:
          if (local_1c8.pVdbe == (Vdbe *)0x0) goto LAB_001325cd;
          if ((iVar4 == 0) && (pVVar7 = local_1c8.pVdbe, db->mallocFailed == '\0'))
          goto LAB_001325cf;
          sqlite3VdbeFinalize(local_1c8.pVdbe);
        }
        pcVar5 = zErrMsg;
        if (zErrMsg == (char *)0x0) {
          sqlite3Error(db,iVar4);
        }
        else {
          sqlite3ErrorWithMsg(db,iVar4,"%s",zErrMsg);
          sqlite3DbFreeNN(db,pcVar5);
        }
        while (p = local_1c8.pTriggerPrg, local_1c8.pTriggerPrg != (TriggerPrg *)0x0) {
          local_1c8.pTriggerPrg = (local_1c8.pTriggerPrg)->pNext;
          sqlite3DbFreeNN(db,p);
        }
      }
      else {
        if (nBytes <= db->aLimit[1]) {
          pcVar5 = sqlite3DbStrNDup(db,zSql,local_1e8);
          if (pcVar5 == (char *)0x0) {
            local_1c8.zTail = local_1e0;
          }
          else {
            sqlite3RunParser(&local_1c8,pcVar5,&zErrMsg);
            local_1c8.zTail = zSql + ((long)local_1c8.zTail - (long)pcVar5);
            sqlite3DbFreeNN(db,pcVar5);
          }
          goto LAB_001323ef;
        }
        sqlite3ErrorWithMsg(db,0x12,"statement too long");
        iVar4 = sqlite3ApiExit(db,0x12);
      }
LAB_0013262d:
      sqlite3ParserReset(&local_1c8);
      bVar9 = bVar3;
    } while (iVar4 == 0x201);
    if (iVar4 != 0x11) break;
    sqlite3ResetOneSchema(db,-1);
    bVar9 = false;
  } while (bVar3);
  sqlite3BtreeLeaveAll(db);
  iVar4 = sqlite3ApiExit(db,iVar4);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar4;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
  }while( rc==SQLITE_ERROR_RETRY
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}